

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O0

void skill_help(int *r_skills,int *c_skills,wchar_t mhp,wchar_t infra)

{
  short local_48;
  short local_40;
  uint local_3c;
  short local_38 [2];
  uint i;
  int16_t skills [10];
  wchar_t infra_local;
  wchar_t mhp_local;
  int *c_skills_local;
  int *r_skills_local;
  
  for (local_3c = 0; local_3c < 10; local_3c = local_3c + 1) {
    if (r_skills == (int *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = (short)r_skills[local_3c];
    }
    if (c_skills == (int *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = (short)c_skills[local_3c];
    }
    local_38[local_3c] = local_40 + local_48;
  }
  skills._16_4_ = infra;
  text_out_e("Hit/Shoot/Throw: %+d/%+d/%+d  Hit die: %2d\n",(ulong)(uint)(int)skills[2],
             (ulong)(uint)(int)skills[3],(ulong)(uint)(int)skills[4],(ulong)(uint)mhp);
  text_out_e("Disarm: %+3d/%+3d   Devices: %+3d\n",(ulong)(uint)(int)local_38[0],
             (ulong)(uint)(int)local_38[1],(ulong)(uint)(int)(short)i);
  text_out_e("Save:       %+3d   Stealth: %+3d\n",(ulong)(uint)(int)i._2_2_,
             (ulong)(uint)(int)skills[1]);
  text_out_e("Digging:    %+3d   Search:  %+3d\n",(ulong)(uint)(int)skills[5],
             (ulong)(uint)(int)skills[0]);
  if (-1 < (int)skills._16_4_) {
    text_out_e("Infravision:  %d ft\n",(ulong)(uint)(skills._16_4_ * 10));
  }
  return;
}

Assistant:

static void skill_help(const int r_skills[], const int c_skills[], int mhp, int infra)
{
	int16_t skills[SKILL_MAX];
	unsigned i;

	for (i = 0; i < SKILL_MAX ; ++i)
		skills[i] = (r_skills ? r_skills[i] : 0 ) + (c_skills ? c_skills[i] : 0);

	text_out_e("Hit/Shoot/Throw: %+d/%+d/%+d  Hit die: %2d\n",
			   skills[SKILL_TO_HIT_MELEE], skills[SKILL_TO_HIT_BOW],
			   skills[SKILL_TO_HIT_THROW], mhp);
	text_out_e("Disarm: %+3d/%+3d   Devices: %+3d\n", skills[SKILL_DISARM_PHYS],
			   skills[SKILL_DISARM_MAGIC], skills[SKILL_DEVICE]);
	text_out_e("Save:       %+3d   Stealth: %+3d\n", skills[SKILL_SAVE],
			   skills[SKILL_STEALTH]);
	text_out_e("Digging:    %+3d   Search:  %+3d\n", skills[SKILL_DIGGING],
			   skills[SKILL_SEARCH]);
	if (infra >= 0)
		text_out_e("Infravision:  %d ft\n", infra * 10);
}